

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trust_token.cc
# Opt level: O0

uint8_t get_metadata_obfuscator
                  (uint8_t *key,size_t key_len,uint8_t *client_data,size_t client_data_len)

{
  undefined1 local_b8 [8];
  SHA256_CTX sha_ctx;
  uint8_t metadata_obfuscator [32];
  size_t client_data_len_local;
  uint8_t *client_data_local;
  size_t key_len_local;
  uint8_t *key_local;
  
  SHA256_Init((SHA256_CTX *)local_b8);
  SHA256_Update((SHA256_CTX *)local_b8,key,key_len);
  SHA256_Update((SHA256_CTX *)local_b8,client_data,client_data_len);
  SHA256_Final((uchar *)&sha_ctx.num,(SHA256_CTX *)local_b8);
  return (uint8_t)((int)(uint)(byte)sha_ctx.num >> 7);
}

Assistant:

static uint8_t get_metadata_obfuscator(const uint8_t *key, size_t key_len,
                                       const uint8_t *client_data,
                                       size_t client_data_len) {
  uint8_t metadata_obfuscator[SHA256_DIGEST_LENGTH];
  SHA256_CTX sha_ctx;
  SHA256_Init(&sha_ctx);
  SHA256_Update(&sha_ctx, key, key_len);
  SHA256_Update(&sha_ctx, client_data, client_data_len);
  SHA256_Final(metadata_obfuscator, &sha_ctx);
  return metadata_obfuscator[0] >> 7;
}